

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O3

void ast::Relocations::relocate(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte bVar1;
  uint section;
  uint offset;
  long lVar2;
  pointer pcVar3;
  Location *pLVar4;
  string *psVar5;
  uint16_t uVar6;
  Value_type VVar7;
  uint uVar8;
  uint uVar9;
  iterator iVar10;
  byte bVar11;
  undefined8 *puVar12;
  _Alloc_hider _Var13;
  string local_158;
  Location *local_138;
  key_type local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar12 = list_abi_cxx11_;
  if ((undefined8 **)list_abi_cxx11_ != &list_abi_cxx11_) {
    do {
      lVar2 = puVar12[2];
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x28);
      if (*(long *)(lVar2 + 0x30) == 0) {
LAB_001251a0:
        section = *(uint *)(lVar2 + 0x10);
        offset = *(uint *)(lVar2 + 0x14);
        uVar6 = Sections::read16(section,offset);
        bVar1 = *(byte *)(lVar2 + 0x1c);
        if (*(long *)(lVar2 + 0x30) == 0) {
          uVar8 = *(uint *)(lVar2 + 0x48);
        }
        else {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar3 = (__rhs->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar3,pcVar3 + *(long *)(lVar2 + 0x30));
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)Symbols::table_abi_cxx11_,&local_130);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar8 = (uint)((ulong)(DAT_0013da98 - Sections::table) >> 3);
          }
          else {
            uVar8 = *(uint *)(*(long *)((long)iVar10.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
                                              ._M_cur + 0x28) + 0x3c);
          }
          uVar8 = Sections::get_address(uVar8);
          uVar8 = uVar8 + *(int *)(lVar2 + 0x48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
        }
        if (*(int *)(lVar2 + 0x20) == 2) {
          if ((uVar8 & 1) != 0) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_b0,"Target address is odd: %+d (0x%x)",(ulong)uVar8,(ulong)uVar8);
            warning_report(pLVar4,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
          }
          uVar9 = Sections::get_address(section);
          uVar8 = uVar8 - (uVar9 + offset);
          if ((int)uVar8 < 0) {
            local_138 = *(Location **)(lVar2 + 8);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"Indicated address must be higher than current location",
                       "");
            error_report(local_138,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          if (1 << ((char)*(undefined4 *)(lVar2 + 0x1c) + 1U & 0x1f) <= (int)uVar8) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_f0,
                       "Interval between PC and target address: %+d (0x%x), isn\'t codable with %d bit"
                       ,(ulong)uVar8,(ulong)uVar8);
            error_report(pLVar4,&local_f0);
            psVar5 = &local_f0;
            _Var13._M_p = local_f0._M_dataplus._M_p;
LAB_0012543f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p != &psVar5->field_2) {
              operator_delete(_Var13._M_p);
            }
          }
LAB_0012544e:
          uVar8 = (int)uVar8 >> 1;
        }
        else {
          if (*(int *)(lVar2 + 0x20) == 1) {
            if ((uVar8 & 1) != 0) {
              pLVar4 = *(Location **)(lVar2 + 8);
              string_printf_abi_cxx11_
                        (&local_70,"Target address is odd: %+d (0x%x)",(ulong)uVar8,(ulong)uVar8);
              warning_report(pLVar4,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
            }
            uVar9 = Sections::get_address(section);
            bVar11 = (byte)*(int *)(lVar2 + 0x1c);
            uVar8 = uVar8 - (uVar9 + offset);
            if ((int)uVar8 < -1 << (bVar11 & 0x1f) || 1 << (bVar11 & 0x1f) <= (int)uVar8) {
              pLVar4 = *(Location **)(lVar2 + 8);
              string_printf_abi_cxx11_
                        (&local_90,
                         "Interval between PC and target address: %+d (0x%x), isn\'t codable in %d bit two\'s complementxx"
                         ,(ulong)uVar8,(ulong)uVar8,(ulong)(*(int *)(lVar2 + 0x1c) + 1));
              error_report(pLVar4,&local_90);
              psVar5 = &local_90;
              _Var13._M_p = local_90._M_dataplus._M_p;
              goto LAB_0012543f;
            }
            goto LAB_0012544e;
          }
          if (1 << ((byte)*(undefined4 *)(lVar2 + 0x1c) & 0x1f) < (int)uVar8) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_110,"Expression\'s value: %d (0x%x) isn\'t codable in %d bit",
                       (ulong)uVar8,(ulong)uVar8);
            error_report(pLVar4,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
          }
        }
        uVar9 = ~(-1 << (bVar1 & 0x1f));
        Sections::write16(section,offset,
                          (ushort)((uVar8 & uVar9) << (*(byte *)(lVar2 + 0x18) & 0x1f)) |
                          uVar6 & ~(ushort)(uVar9 << (*(byte *)(lVar2 + 0x18) & 0x1f)));
      }
      else {
        pcVar3 = (__rhs->_M_dataplus)._M_p;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar3,pcVar3 + *(long *)(lVar2 + 0x30));
        VVar7 = Symbols::get_type(&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (VVar7 != UNDEFINED) goto LAB_001251a0;
        pLVar4 = *(Location **)(lVar2 + 8);
        std::operator+(&local_50,"Undefined symbol: ",__rhs);
        error_report(pLVar4,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      puVar12 = (undefined8 *)*puVar12;
    } while ((undefined8 **)puVar12 != &list_abi_cxx11_);
  }
  return;
}

Assistant:

void Relocations::relocate()
{
	for (auto reloc: list) {
		if ( ! reloc->symbol.empty()) {
			if (Symbols::get_type(reloc->symbol) == UNDEFINED) {
				error_report(reloc->exp_location, "Undefined symbol: " + reloc->symbol);
				continue;
			}
		}
		auto section = reloc->section_index;
		auto offset = reloc->section_offset;
		auto content = Sections::read16(section, offset);
		auto mask = MAKE_MASK(reloc->width, 0U);
		//  Saltos para endereços absolutos geram relocations relativas sem simbolo associado
		auto value = 0;	// Valor com sinal
		value = (reloc->symbol.empty() ? 0 : Sections::get_address(Symbols::get_section(reloc->symbol)))
				+ reloc->addend;
		if (reloc->type == Relocation::Relocation_type::RELATIVE) {
			// Nas instruções branch os offsets são codificados em número de instruções (value / 2)
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value >= (1 << reloc->width) || value < (~0 << reloc->width))	// signed
				error_report(reloc->exp_location,
						 string_printf("Interval between PC and target address: %+d (0x%x), "
								"isn't codable in %d bit two's complementxx",
								value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (reloc->type == Relocation::Relocation_type::RELATIVE_UNSIGNED) {	// usado no ldr rd, label
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value < 0)
				error_report(reloc->exp_location,
							"Indicated address must be higher than current location");
			if (value >= (1 << (reloc->width + 1)))
				error_report(reloc->exp_location,
					string_printf("Interval between PC and target address: %+d (0x%x), "
							"isn't codable with %d bit",
							value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (value > (1 << reloc->width)) { // Relocation::Type::ABSOLUTE
			error_report(reloc->exp_location,
				string_printf("Expression's value: %d (0x%x) isn't codable in %d bit",
					value, value, reloc->width));
		}
		content &= ~(mask << reloc->position);
		content |= (value & mask) << reloc->position;
		Sections::write16(section, offset, content);
	}
}